

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O1

void merge_3way(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
               uchar **result)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  uchar *__s2;
  uchar *__s2_00;
  uchar *__s1;
  uchar **local_60;
  uchar **local_58;
  uchar **local_50;
  size_t local_48;
  uchar **local_40;
  size_t local_38;
  
  __s1 = *from0;
  if (__s1 == (uchar *)0x0) {
LAB_001b6f2f:
    __assert_fail("a != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                  ,0x32,"int cmp(const unsigned char *, const unsigned char *)");
  }
  __s2 = *from1;
  if (__s2 != (uchar *)0x0) {
    local_60 = result;
    __s2_00 = *from2;
    iVar2 = strcmp((char *)__s1,(char *)__s2);
    if (__s2_00 != (uchar *)0x0) {
      iVar3 = strcmp((char *)__s2,(char *)__s2_00);
      local_50 = from2;
      local_40 = from0;
      local_58 = from1;
      local_48 = n2;
      if (-1 < iVar2) {
        if (iVar2 == 0) {
          if (iVar3 < 0) goto LAB_001b6d93;
          if (iVar3 != 0) goto LAB_001b6c85;
          goto LAB_001b6d38;
        }
        if (0 < iVar3) goto LAB_001b6922;
        if (iVar3 == 0) goto LAB_001b6adf;
        iVar2 = strcmp((char *)__s1,(char *)__s2_00);
        if (iVar2 < 0) goto LAB_001b6a19;
        if (iVar2 != 0) goto LAB_001b6adf;
        goto LAB_001b6e30;
      }
      if (iVar3 < 0) goto LAB_001b6d93;
      if (iVar3 == 0) goto LAB_001b6d38;
      iVar2 = strcmp((char *)__s1,(char *)__s2_00);
      if (iVar2 < 1) goto LAB_001b686b;
LAB_001b6b95:
      do {
        lVar7 = 0;
        do {
          *(uchar **)((long)local_60 + lVar7) = __s2_00;
          local_38 = n1;
          if (local_48 == 1) goto LAB_001b6d05;
          __s2_00 = *(uchar **)((long)local_50 + lVar7 + 8);
          if (__s2_00 == (uchar *)0x0) goto LAB_001b6f2f;
          if (__s1 == (uchar *)0x0) goto LAB_001b6f10;
          iVar2 = strcmp((char *)__s2_00,(char *)__s1);
          uVar6 = 5;
          if (-1 < iVar2) {
            if (iVar2 == 0) {
              uVar6 = 0x10;
            }
            else {
              if (__s2 == (uchar *)0x0) goto LAB_001b6f10;
              iVar2 = strcmp((char *)__s2_00,(char *)__s2);
              uVar6 = 2;
              if (iVar2 == 0) {
                uVar6 = 0x11;
              }
              if (iVar2 < 0) {
                uVar6 = 4;
              }
            }
          }
          lVar7 = lVar7 + 8;
          local_48 = local_48 - 1;
        } while (uVar6 == 5);
        if (uVar6 < 0x10) {
          if (uVar6 == 2) {
            local_60 = (uchar **)((long)local_60 + lVar7);
            local_50 = (uchar **)((long)local_50 + lVar7);
            goto LAB_001b6d93;
          }
          if (uVar6 != 4) {
            return;
          }
        }
        else if (uVar6 != 0x10) {
          if (uVar6 == 0x11) {
            local_60 = (uchar **)((long)local_60 + lVar7);
            local_50 = (uchar **)((long)local_50 + lVar7);
            goto LAB_001b6d38;
          }
switchD_001b6b7a_caseD_6:
          return;
        }
        local_60 = (uchar **)((long)local_60 + lVar7);
        local_50 = (uchar **)((long)local_50 + lVar7);
LAB_001b686b:
        lVar7 = 0;
        do {
          *(uchar **)((long)local_60 + lVar7) = __s1;
          sVar1 = n1;
          if (n0 == 1) goto LAB_001b6eb3;
          __s1 = *(uchar **)((long)local_40 + lVar7 + 8);
          if (__s1 == (uchar *)0x0) goto LAB_001b6f2f;
          if (__s2_00 == (uchar *)0x0) goto LAB_001b6f10;
          iVar2 = strcmp((char *)__s1,(char *)__s2_00);
          bVar4 = 4;
          if (0 < iVar2) {
            if (__s2 == (uchar *)0x0) goto LAB_001b6f10;
            iVar2 = strcmp((char *)__s1,(char *)__s2);
            bVar4 = iVar2 == 0 ^ 7;
            if (iVar2 < 0) {
              bVar4 = 5;
            }
          }
          lVar7 = lVar7 + 8;
          n0 = n0 - 1;
        } while (bVar4 == 4);
        if (bVar4 != 5) {
          if (bVar4 != 6) {
            local_60 = (uchar **)((long)local_60 + lVar7);
            local_40 = (uchar **)((long)local_40 + lVar7);
            goto LAB_001b6922;
          }
          local_60 = (uchar **)((long)local_60 + lVar7);
          local_40 = (uchar **)((long)local_40 + lVar7);
LAB_001b6c85:
          lVar7 = 0;
          do {
            *(uchar **)((long)local_60 + lVar7) = __s2_00;
            local_38 = n1;
            if (local_48 == 1) goto LAB_001b6d05;
            __s2_00 = *(uchar **)((long)local_50 + lVar7 + 8);
            if (__s2_00 == (uchar *)0x0) goto LAB_001b6f2f;
            if (__s1 == (uchar *)0x0) goto LAB_001b6f10;
            iVar2 = strcmp((char *)__s2_00,(char *)__s1);
            bVar4 = iVar2 == 0 | 2;
            if (iVar2 < 0) {
              bVar4 = 6;
            }
            lVar7 = lVar7 + 8;
            local_48 = local_48 - 1;
          } while (bVar4 == 6);
          if (bVar4 != 2) {
            local_60 = (uchar **)((long)local_60 + lVar7);
            local_50 = (uchar **)((long)local_50 + lVar7);
            goto LAB_001b6d38;
          }
          local_60 = (uchar **)((long)local_60 + lVar7);
          local_50 = (uchar **)((long)local_50 + lVar7);
LAB_001b6d93:
          lVar7 = 0;
          do {
            *(uchar **)((long)local_60 + lVar7) = __s1;
            sVar1 = n1;
            if (n0 == 1) goto LAB_001b6eb3;
            __s1 = *(uchar **)((long)local_40 + lVar7 + 8);
            if (__s1 == (uchar *)0x0) goto LAB_001b6f2f;
            if (__s2 == (uchar *)0x0) goto LAB_001b6f10;
            iVar2 = strcmp((char *)__s1,(char *)__s2);
            cVar5 = '\x02';
            if (0 < iVar2) {
              if (__s2_00 == (uchar *)0x0) goto LAB_001b6f10;
              iVar2 = strcmp((char *)__s1,(char *)__s2_00);
              cVar5 = (iVar2 == 0) * '\x02' + '\b';
              if (iVar2 < 0) {
                cVar5 = '\t';
              }
            }
            lVar7 = lVar7 + 8;
            n0 = n0 - 1;
          } while (cVar5 == '\x02');
          if (cVar5 == '\b') goto LAB_001b6ea4;
          if (cVar5 == '\t') {
            local_60 = (uchar **)((long)local_60 + lVar7);
            local_40 = (uchar **)((long)local_40 + lVar7);
            goto LAB_001b6a19;
          }
          if (cVar5 != '\n') {
            return;
          }
          local_60 = (uchar **)((long)local_60 + lVar7);
          local_40 = (uchar **)((long)local_40 + lVar7);
LAB_001b6e30:
          lVar7 = 0;
          do {
            *(uchar **)((long)local_60 + lVar7) = __s2;
            if (n1 == 1) goto LAB_001b6ede;
            __s2 = *(uchar **)((long)local_58 + lVar7 + 8);
            if (__s2 == (uchar *)0x0) goto LAB_001b6f2f;
            if (__s1 == (uchar *)0x0) goto LAB_001b6f10;
            iVar2 = strcmp((char *)__s2,(char *)__s1);
            cVar5 = (iVar2 != 0) + '\x03';
            if (iVar2 < 0) {
              cVar5 = '\n';
            }
            lVar7 = lVar7 + 8;
            n1 = n1 - 1;
          } while (cVar5 == '\n');
          if (cVar5 == '\x03') {
LAB_001b6ad0:
            local_60 = (uchar **)((long)local_60 + lVar7);
            local_58 = (uchar **)((long)local_58 + lVar7);
LAB_001b6d38:
            lVar7 = 0;
            do {
              *(uchar **)((long)local_60 + lVar7) = __s1;
              sVar1 = n1;
              if (n0 == 1) goto LAB_001b6eb3;
              __s1 = *(uchar **)((long)local_40 + lVar7 + 8);
              if (__s1 == (uchar *)0x0) goto LAB_001b6f2f;
              if (*local_58 == (uchar *)0x0) goto LAB_001b6f10;
              iVar2 = strcmp((char *)__s1,(char *)*local_58);
              lVar7 = lVar7 + 8;
              n0 = n0 - 1;
            } while (iVar2 < 1);
LAB_001b6ea4:
            local_60 = (uchar **)((long)local_60 + lVar7);
            local_40 = (uchar **)((long)local_40 + lVar7);
LAB_001b6adf:
            do {
              lVar7 = 0;
              do {
                *(uchar **)((long)local_60 + lVar7) = __s2;
                if (n1 == 1) goto LAB_001b6ede;
                __s2 = *(uchar **)((long)local_58 + lVar7 + 8);
                if (__s2 == (uchar *)0x0) goto LAB_001b6f2f;
                if (__s2_00 == (uchar *)0x0) goto LAB_001b6f10;
                iVar2 = strcmp((char *)__s2,(char *)__s2_00);
                cVar5 = '\b';
                if (-1 < iVar2) {
                  if (iVar2 == 0) {
                    cVar5 = '\r';
                  }
                  else {
                    if (__s1 == (uchar *)0x0) goto LAB_001b6f10;
                    iVar2 = strcmp((char *)__s2,(char *)__s1);
                    cVar5 = (iVar2 == 0) * '\t' + '\x05';
                    if (iVar2 < 0) {
                      cVar5 = '\a';
                    }
                  }
                }
                lVar7 = lVar7 + 8;
                n1 = n1 - 1;
              } while (cVar5 == '\b');
              switch(cVar5) {
              case '\x05':
                local_60 = (uchar **)((long)local_60 + lVar7);
                local_58 = (uchar **)((long)local_58 + lVar7);
                goto LAB_001b6b95;
              default:
                goto switchD_001b6b7a_caseD_6;
              case '\a':
                local_60 = (uchar **)((long)local_60 + lVar7);
                local_58 = (uchar **)((long)local_58 + lVar7);
LAB_001b6922:
                lVar7 = 0;
                do {
                  *(uchar **)((long)local_60 + lVar7) = __s2_00;
                  local_38 = n1;
                  if (local_48 == 1) goto LAB_001b6d05;
                  __s2_00 = *(uchar **)((long)local_50 + lVar7 + 8);
                  if (__s2_00 == (uchar *)0x0) goto LAB_001b6f2f;
                  if (__s2 == (uchar *)0x0) goto LAB_001b6f10;
                  iVar2 = strcmp((char *)__s2_00,(char *)__s2);
                  uVar6 = 7;
                  if (-1 < iVar2) {
                    if (iVar2 == 0) {
                      uVar6 = 0x12;
                    }
                    else {
                      if (__s1 == (uchar *)0x0) goto LAB_001b6f10;
                      iVar2 = strcmp((char *)__s2_00,(char *)__s1);
                      uVar6 = 9;
                      if (iVar2 == 0) {
                        uVar6 = 0x13;
                      }
                      if (iVar2 < 0) {
                        uVar6 = 8;
                      }
                    }
                  }
                  lVar7 = lVar7 + 8;
                  local_48 = local_48 - 1;
                } while (uVar6 == 7);
                if (uVar6 < 0x12) {
                  if (uVar6 != 8) goto code_r0x001b69c9;
                }
                else if (uVar6 != 0x12) {
                  if (uVar6 != 0x13) {
                    return;
                  }
                  local_60 = (uchar **)((long)local_60 + lVar7);
                  local_50 = (uchar **)((long)local_50 + lVar7);
                  goto LAB_001b6e30;
                }
                local_60 = (uchar **)((long)local_60 + lVar7);
                local_50 = (uchar **)((long)local_50 + lVar7);
                break;
              case '\r':
                local_60 = (uchar **)((long)local_60 + lVar7);
                local_58 = (uchar **)((long)local_58 + lVar7);
                break;
              case '\x0e':
                local_60 = (uchar **)((long)local_60 + lVar7);
                local_58 = (uchar **)((long)local_58 + lVar7);
                goto LAB_001b6c85;
              }
            } while( true );
          }
LAB_001b6e95:
          local_60 = (uchar **)((long)local_60 + lVar7);
          local_58 = (uchar **)((long)local_58 + lVar7);
          goto LAB_001b686b;
        }
        local_60 = (uchar **)((long)local_60 + lVar7);
        local_40 = (uchar **)((long)local_40 + lVar7);
      } while( true );
    }
  }
LAB_001b6f10:
  __assert_fail("b != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort.cpp"
                ,0x33,"int cmp(const unsigned char *, const unsigned char *)");
LAB_001b6eb3:
  n0 = sVar1;
  lVar7 = (long)local_60 + lVar7;
  local_38 = local_48;
  local_40 = local_58;
  goto LAB_001b6efd;
code_r0x001b69c9:
  if (uVar6 != 9) {
    return;
  }
  local_60 = (uchar **)((long)local_60 + lVar7);
  local_50 = (uchar **)((long)local_50 + lVar7);
LAB_001b6a19:
  lVar7 = 0;
  do {
    *(uchar **)((long)local_60 + lVar7) = __s2;
    if (n1 == 1) goto LAB_001b6ede;
    __s2 = *(uchar **)((long)local_58 + lVar7 + 8);
    if (__s2 == (uchar *)0x0) goto LAB_001b6f2f;
    if (__s1 == (uchar *)0x0) goto LAB_001b6f10;
    iVar2 = strcmp((char *)__s2,(char *)__s1);
    bVar4 = 9;
    if (-1 < iVar2) {
      if (iVar2 == 0) {
        bVar4 = 0xc;
      }
      else {
        if (__s2_00 == (uchar *)0x0) goto LAB_001b6f10;
        iVar2 = strcmp((char *)__s2,(char *)__s2_00);
        bVar4 = (iVar2 != 0) + 3;
        if (iVar2 < 0) {
          bVar4 = 2;
        }
      }
    }
    lVar7 = lVar7 + 8;
    n1 = n1 - 1;
  } while (bVar4 == 9);
  if (bVar4 < 4) {
    if (bVar4 != 2) {
      if (bVar4 != 3) {
        return;
      }
      goto LAB_001b6ad0;
    }
  }
  else {
    if (bVar4 == 4) goto LAB_001b6e95;
    if (bVar4 != 0xc) {
      return;
    }
  }
  local_60 = (uchar **)((long)local_60 + lVar7);
  local_58 = (uchar **)((long)local_58 + lVar7);
  goto LAB_001b6d93;
LAB_001b6ede:
  lVar7 = (long)local_60 + lVar7;
  local_38 = local_48;
  goto LAB_001b6efd;
LAB_001b6d05:
  lVar7 = (long)local_60 + lVar7;
  local_50 = local_58;
LAB_001b6efd:
  merge_2way(local_40,n0,local_50,local_38,(uchar **)(lVar7 + 8));
  return;
}

Assistant:

static void
merge_3way(unsigned char** restrict from0, size_t n0,
           unsigned char** restrict from1, size_t n1,
           unsigned char** restrict from2, size_t n2,
           unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2<<"\n";
	unsigned char* key0 = *from0;
	unsigned char* key1 = *from1;
	unsigned char* key2 = *from2;
	const int cmp01 = cmp(key0, key1);
	const int cmp12 = cmp(key1, key2);
	int cmp02 = 0;
	if (cmp01 < 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		cmp02 = cmp(key0, key2);
		if (cmp02 <= 0) { goto state0lt2lt1; }
		goto state2lt0lt1;
	}
	if (cmp01 == 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		goto state2lt0eq1;
	}
	if (cmp12 > 0)  { goto state2lt1lt0; }
	if (cmp12 == 0) { goto state1lt2lt0; }
	cmp02 = cmp(key0, key2);
	if (cmp02 < 0)  { goto state1lt0lt2; }
	if (cmp02 == 0) { goto state1lt0eq2; }
	goto state1lt2lt0;

#define StrictCase(a,b,c)                                                      \
        state##a##lt##b##lt##c:                                                \
        {                                                                      \
                *result++ = key##a;                                            \
                if (--n##a == 0) goto finish##a;                               \
                ++from##a;                                                     \
                key##a = *from##a;                                             \
                const int cmpab = cmp(key##a, key##b);                         \
                if (cmpab < 0)  goto state##a##lt##b##lt##c;                   \
                if (cmpab == 0) goto state##a##eq##b##lt##c;                   \
                const int cmpac = cmp(key##a, key##c);                         \
                if (cmpac < 0)  goto state##b##lt##a##lt##c;                   \
                if (cmpac == 0) goto state##b##lt##a##eq##c;                   \
                goto state##b##lt##c##lt##a;                                   \
        }
        StrictCase(1, 0, 2)
        StrictCase(1, 2, 0)
        StrictCase(2, 0, 1)
        StrictCase(2, 1, 0)
#undef StrictCase

state0lt1lt2:
{
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp01 = cmp(key0, key1);
	if (cmp01 <= 0) goto state0lt1lt2;
	const int cmp02 = cmp(key0, key2);
	if (cmp02 < 0)  goto state1lt0lt2;
	if (cmp02 == 0) goto state1lt0eq2;
	goto state1lt2lt0;
}
state0lt2lt1:
{
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp02 = cmp(key0, key2);
	if (cmp02 <= 0) goto state0lt2lt1;
	const int cmp01 = cmp(key0, key1);
	if (cmp01 < 0)  goto state2lt0lt1;
	if (cmp01 == 0) goto state2lt0eq1;
	goto state2lt1lt0;
}

// No advantage from equality of first two strings.
state0eq1lt2: goto state0lt1lt2;
state0eq2lt1: goto state0lt2lt1;
state1eq2lt0: goto state1lt2lt0;

// Fix order.
state2eq0lt1: goto state0eq2lt1;
state1eq0lt2: goto state0eq1lt2;
state2eq1lt0: goto state1eq2lt0;

state0lt1eq2:
{
	*result++ = key0;
	if (--n0 == 0) goto finish0;
	++from0;
	key0 = *from0;
	const int cmp01 = cmp(*from0, *from1);
	if (cmp01 <= 0) goto state0lt1eq2;
	goto state1lt2lt0;
}
state1lt0eq2:
{
	*result++ = key1;
	if (--n1 == 0) goto finish1;
	++from1;
	key1 = *from1;
	const int cmp10 = cmp(key1, key0);
	if (cmp10 < 0)  goto state1lt0eq2;
	if (cmp10 == 0) goto state0lt1eq2;
	goto state0lt2lt1;
}
state2lt0eq1:
{
	*result++ = key2;
	if (--n2 == 0) goto finish2;
	++from2;
	key2 = *from2;
	const int cmp20 = cmp(key2, key0);
	if (cmp20 < 0)  goto state2lt0eq1;
	if (cmp20 == 0) goto state0lt1eq2;
	goto state0lt1lt2;
}
state0lt2eq1: goto state0lt1eq2;
state1lt2eq0: goto state1lt0eq2;
state2lt1eq0: goto state2lt0eq1;

finish0:
	assert(n0 == 0);
	merge_2way(from1, n1, from2, n2, result);
	return;
finish1:
	assert(n1 == 0);
	merge_2way(from0, n0, from2, n2, result);
	return;
finish2:
	assert(n2 == 0);
	merge_2way(from0, n0, from1, n1, result);
	return;
}